

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UgridReader.hpp
# Opt level: O2

vector<double,_std::allocator<double>_> *
Parfait::UgridReader::readNodes
          (vector<double,_std::allocator<double>_> *__return_storage_ptr__,string *filename,
          bool swapBytes)

{
  int nnodes;
  int nhex;
  int nprism;
  int npyr;
  int ntet;
  int nquad;
  int ntri;
  string local_60;
  string local_40;
  
  std::__cxx11::string::string((string *)&local_40,(string *)filename);
  readHeader(&local_40,&nnodes,&ntri,&nquad,&ntet,&npyr,&nprism,&nhex,swapBytes);
  std::__cxx11::string::~string((string *)&local_40);
  std::__cxx11::string::string((string *)&local_60,(string *)filename);
  readNodes(__return_storage_ptr__,&local_60,0,nnodes,swapBytes);
  std::__cxx11::string::~string((string *)&local_60);
  return __return_storage_ptr__;
}

Assistant:

inline std::vector<double> Parfait::UgridReader::readNodes(std::string filename,bool swapBytes) {
    int nnodes,ntri,nquad,ntet,npyr,nprism,nhex;
    readHeader(filename,nnodes,ntri,nquad,ntet,npyr,nprism,nhex,swapBytes);	
    return readNodes(filename,0,nnodes,swapBytes);
}